

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *imgui_ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  value_type pIVar2;
  int iVar3;
  value_type *ppIVar4;
  value_type *pvVar5;
  char *pcVar6;
  char *p;
  char *name;
  ImGuiWindowSettings *settings_1;
  ImGuiWindowSettings *pIStack_40;
  int i_1;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  int i;
  ImGuiContext *g;
  ImGuiTextBuffer *buf_local;
  ImGuiSettingsHandler *handler_local;
  ImGuiContext *imgui_ctx_local;
  
  for (window._4_4_ = 0; window._4_4_ != (imgui_ctx->Windows).Size; window._4_4_ = window._4_4_ + 1)
  {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&imgui_ctx->Windows,window._4_4_);
    pIVar2 = *ppIVar4;
    if ((pIVar2->Flags & 0x100U) == 0) {
      pIStack_40 = ImGui::FindWindowSettings(pIVar2->ID);
      if (pIStack_40 == (ImGuiWindowSettings *)0x0) {
        pIStack_40 = AddWindowSettings(pIVar2->Name);
      }
      pIStack_40->Pos = pIVar2->Pos;
      pIStack_40->Size = pIVar2->SizeFull;
      pIStack_40->Collapsed = (bool)(pIVar2->Collapsed & 1);
    }
  }
  iVar3 = ImGuiTextBuffer::size(buf);
  ImGuiTextBuffer::reserve(buf,iVar3 + (imgui_ctx->SettingsWindows).Size * 0x60);
  for (settings_1._4_4_ = 0; settings_1._4_4_ != (imgui_ctx->SettingsWindows).Size;
      settings_1._4_4_ = settings_1._4_4_ + 1) {
    pvVar5 = ImVector<ImGuiWindowSettings>::operator[](&imgui_ctx->SettingsWindows,settings_1._4_4_)
    ;
    fVar1 = (pvVar5->Pos).x;
    if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
      p = pvVar5->Name;
      pcVar6 = strstr(p,"###");
      if (pcVar6 != (char *)0x0) {
        p = pcVar6;
      }
      ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,p);
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)(pvVar5->Pos).x,
                 (ulong)(uint)(int)(pvVar5->Pos).y);
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)(pvVar5->Size).x,
                 (ulong)(uint)(int)(pvVar5->Size).y);
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)(pvVar5->Collapsed & 1));
      ImGuiTextBuffer::appendf(buf,"\n");
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* imgui_ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    ImGuiContext& g = *imgui_ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;
        ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID);
        if (!settings)
            settings = AddWindowSettings(window->Name);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write a buffer
    // If a window wasn't opened in this session we preserve its settings
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        buf->appendf("[%s][%s]\n", handler->TypeName, name);
        buf->appendf("Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        buf->appendf("Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}